

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TUDPTransportTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::testutils::TUDPTransport_testUDPTransport_Test::TUDPTransport_testUDPTransport_Test
          (TUDPTransport_testUDPTransport_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00222488;
  return;
}

Assistant:

TEST(TUDPTransport, testUDPTransport)
{
    const std::string message("test");

    TUDPTransport server(net::IPAddress::v4("127.0.0.1", 0));
    server.open();  // Not necessary. Just making sure this is called.
    ASSERT_TRUE(server.isOpen());

    const auto serverAddr = server.addr();
    std::thread clientThread([serverAddr, message]() {
        net::Socket connUDP;
        connUDP.open(AF_INET, SOCK_DGRAM);
        const auto numWritten =
            ::sendto(connUDP.handle(),
                     message.c_str(),
                     message.size(),
                     0,
                     reinterpret_cast<const ::sockaddr*>(&serverAddr.addr()),
                     serverAddr.addrLen());
        ASSERT_EQ(numWritten, message.size());

        std::array<char, kBufferSize> buffer;
        const auto numRead = ::recvfrom(
            connUDP.handle(), &buffer[0], buffer.size(), 0, nullptr, 0);
        const std::string received(&buffer[0], &buffer[numRead]);
        ASSERT_EQ(message.size(), numRead);
        ASSERT_EQ(message, received);

        connUDP.close();
    });

    std::array<uint8_t, kBufferSize> buffer;
    const auto numRead = server.readAll(&buffer[0], message.size());
    ASSERT_LT(0, numRead);
    server.write(&buffer[0], numRead);

    clientThread.join();
    server.close();
}